

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void queued_activate(QObject *sender,int signal,Connection *c,void **argv)

{
  QObject *receiver;
  int __sig;
  int *piVar1;
  QMetaCallEvent *this;
  void *pvVar2;
  uint *extraout_RDX;
  long lVar3;
  void **ppvVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QMetaType local_58;
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = (c->argumentTypes).super_QBasicAtomicPointer<const_int>._q_value._M_b._M_p;
  if (piVar1 == (int *)0x0) {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    __sig = (**sender->_vptr_QObject)(sender);
    local_48._0_8_ = QMetaObjectPrivate::signal(__sig,(__sighandler_t)(ulong)(uint)signal);
    local_48._8_8_ = extraout_RDX;
    piVar1 = queuedConnectionTypes((QMetaMethod *)local_48);
    if (piVar1 == (int *)0x0) {
      piVar1 = &DIRECT_CONNECTION_ONLY;
    }
    LOCK();
    bVar7 = (c->argumentTypes).super_QBasicAtomicPointer<const_int>._q_value._M_b._M_p ==
            (__pointer_type)0x0;
    if (bVar7) {
      (c->argumentTypes).super_QBasicAtomicPointer<const_int>._q_value._M_b._M_p = piVar1;
    }
    UNLOCK();
    if (!bVar7) {
      if (piVar1 != &DIRECT_CONNECTION_ONLY) {
        operator_delete__(piVar1);
      }
      piVar1 = (c->argumentTypes).super_QBasicAtomicPointer<const_int>._q_value._M_b._M_p;
    }
  }
  if (piVar1 == &DIRECT_CONNECTION_ONLY) goto LAB_00290abd;
  uVar6 = 0;
  do {
    uVar5 = uVar6;
    uVar6 = uVar5 + 1;
  } while (piVar1[uVar5] != 0);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QBasicMutex>::QMutexLocker
            ((QMutexLocker<QBasicMutex> *)local_48,
             (QBasicMutex *)
             ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
             (ulong)((uint)(((ulong)(c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b.
                                    _M_p & 0xffffffff) % 0x418) & 0x7f8)));
  receiver = (c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p;
  if (receiver != (QObject *)0x0) {
    if ((c->field_0x57 & 0x20) == 0) {
      local_50._M_head_impl = (QSlotObjectBase *)0x0;
    }
    else {
      local_50._M_head_impl = (c->field_6).slotObj;
      if (local_50._M_head_impl != (QSlotObjectBase *)0x0) {
        LOCK();
        ((local_50._M_head_impl)->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             ((local_50._M_head_impl)->m_ref).super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    QBasicMutex::unlock((QBasicMutex *)local_48._0_8_);
    local_48._8_8_ = local_48._8_8_ & 0xffffffffffffff00;
    if ((c->field_0x57 & 0x20) == 0) {
      this = (QMetaCallEvent *)operator_new(0x78);
      QMetaCallEvent::QMetaCallEvent
                (this,c->method_offset,c->method_relative,(c->field_6).callFunction,sender,signal,
                 (int)uVar6);
    }
    else {
      this = (QMetaCallEvent *)operator_new(0x78);
      QMetaCallEvent::QMetaCallEvent(this,(c->field_6).slotObj,sender,signal,(int)uVar6);
    }
    ppvVar4 = (this->d).args_;
    lVar3 = (long)(this->d).nargs_;
    ppvVar4[lVar3] = (void *)0x0;
    *ppvVar4 = (void *)0x0;
    if (1 < uVar6) {
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        QMetaType::QMetaType(&local_58,piVar1[uVar6]);
        ppvVar4[lVar3 + uVar6 + 1] = local_58.d_ptr;
      }
      while( true ) {
        argv = argv + 1;
        ppvVar4 = ppvVar4 + 1;
        bVar7 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar7) break;
        pvVar2 = QMetaType::create((QMetaType *)(ppvVar4 + lVar3),*argv);
        *ppvVar4 = pvVar2;
      }
    }
    if ((-1 < *(int *)&c->field_0x54) || (bVar7 = QObjectPrivate::removeConnection(c), bVar7)) {
      QBasicMutex::lock((QBasicMutex *)local_48._0_8_);
      local_48[8] = 1;
      if ((-1 < *(int *)&c->field_0x54) &&
         ((c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p == (__pointer_type)0x0
         )) {
        QBasicMutex::unlock((QBasicMutex *)local_48._0_8_);
        local_48._8_8_ = local_48._8_8_ & 0xffffffffffffff00;
        goto LAB_00290aa0;
      }
      QCoreApplication::postEvent(receiver,(QEvent *)this,0);
    }
    else {
LAB_00290aa0:
      (*(this->super_QAbstractMetaCallEvent).super_QEvent._vptr_QEvent[1])(this);
    }
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
              ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               &local_50);
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_48);
LAB_00290abd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void queued_activate(QObject *sender, int signal, QObjectPrivate::Connection *c, void **argv)
{
    const int *argumentTypes = c->argumentTypes.loadRelaxed();
    if (!argumentTypes) {
        QMetaMethod m = QMetaObjectPrivate::signal(sender->metaObject(), signal);
        argumentTypes = queuedConnectionTypes(m);
        if (!argumentTypes) // cannot queue arguments
            argumentTypes = &DIRECT_CONNECTION_ONLY;
        if (!c->argumentTypes.testAndSetOrdered(nullptr, argumentTypes)) {
            if (argumentTypes != &DIRECT_CONNECTION_ONLY)
                delete[] argumentTypes;
            argumentTypes = c->argumentTypes.loadRelaxed();
        }
    }
    if (argumentTypes == &DIRECT_CONNECTION_ONLY) // cannot activate
        return;
    int nargs = 1; // include return type
    while (argumentTypes[nargs - 1])
        ++nargs;

    QMutexLocker locker(signalSlotLock(c->receiver.loadRelaxed()));
    QObject *receiver = c->receiver.loadRelaxed();
    if (!receiver) {
        // the connection has been disconnected before we got the lock
        return;
    }

    SlotObjectGuard slotObjectGuard { c->isSlotObject ? c->slotObj : nullptr };
    locker.unlock();

    QMetaCallEvent *ev = c->isSlotObject ?
        new QMetaCallEvent(c->slotObj, sender, signal, nargs) :
        new QMetaCallEvent(c->method_offset, c->method_relative, c->callFunction, sender, signal, nargs);

    void **args = ev->args();
    QMetaType *types = ev->types();

    types[0] = QMetaType(); // return type
    args[0] = nullptr; // return value

    if (nargs > 1) {
        for (int n = 1; n < nargs; ++n)
            types[n] = QMetaType(argumentTypes[n - 1]);

        for (int n = 1; n < nargs; ++n)
            args[n] = types[n].create(argv[n]);
    }

    if (c->isSingleShot && !QObjectPrivate::removeConnection(c)) {
        delete ev;
        return;
    }

    locker.relock();
    if (!c->isSingleShot && !c->receiver.loadRelaxed()) {
        // the connection has been disconnected while we were unlocked
        locker.unlock();
        delete ev;
        return;
    }

    QCoreApplication::postEvent(receiver, ev);
}